

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemastypes.c
# Opt level: O1

int xmlSchemaCompareReplacedStrings(xmlChar *x,xmlChar *y)

{
  byte bVar1;
  uint uVar2;
  byte bVar3;
  byte *pbVar4;
  ulong uVar5;
  bool bVar6;
  
  bVar3 = *x;
  bVar6 = bVar3 == 0;
  if (!bVar6) {
    pbVar4 = x + 1;
    do {
      bVar1 = *y;
      uVar5 = (ulong)bVar1;
      if (uVar5 < 0x21) {
        if ((0x100002600U >> (uVar5 & 0x3f) & 1) == 0) {
          if (uVar5 != 0) goto LAB_001b472c;
          if (!bVar6) {
            return 1;
          }
          break;
        }
        if ((0x20 < bVar3) || ((0x100002600U >> ((ulong)bVar3 & 0x3f) & 1) == 0)) {
          uVar2 = -(uint)(bVar3 < 0x20);
          goto LAB_001b476a;
        }
      }
      else {
LAB_001b472c:
        if ((bVar3 < 0x21) && ((0x100002600U >> ((ulong)bVar3 & 0x3f) & 1) != 0)) {
          uVar2 = (bVar1 < 0x21) - 1;
LAB_001b476a:
          return uVar2 | 1;
        }
        if (bVar3 < bVar1) {
          return -1;
        }
        if (bVar3 != bVar1) {
          return 1;
        }
      }
      y = y + 1;
      bVar3 = *pbVar4;
      pbVar4 = pbVar4 + 1;
      bVar6 = bVar3 == 0;
    } while (!bVar6);
  }
  return -(uint)(*y != 0);
}

Assistant:

static int
xmlSchemaCompareReplacedStrings(const xmlChar *x,
				const xmlChar *y)
{
    int tmp;

    while ((*x != 0) && (*y != 0)) {
	if IS_WSP_BLANK_CH(*y) {
	    if (! IS_WSP_BLANK_CH(*x)) {
		if ((*x - 0x20) < 0)
		    return(-1);
		else
		    return(1);
	    }
	} else {
	    if IS_WSP_BLANK_CH(*x) {
		if ((0x20 - *y) < 0)
		    return(-1);
		else
		    return(1);
	    }
	    tmp = *x - *y;
	    if (tmp < 0)
		return(-1);
	    if (tmp > 0)
		return(1);
	}
	x++;
	y++;
    }
    if (*x != 0)
        return(1);
    if (*y != 0)
        return(-1);
    return(0);
}